

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_transpose(matd_t *a)

{
  int iVar1;
  uint local_28;
  uint local_24;
  int j;
  int i;
  matd_t *m;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x176,"matd_t *matd_transpose(const matd_t *)");
  }
  iVar1 = matd_is_scalar(a);
  if (iVar1 == 0) {
    a_local = matd_create(a->ncols,a->nrows);
    for (local_24 = 0; local_24 < a->nrows; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < a->ncols; local_28 = local_28 + 1) {
        a_local[(ulong)(local_28 * a_local->ncols + local_24) + 1] =
             a[(ulong)(local_24 * a->ncols + local_28) + 1];
      }
    }
  }
  else {
    a_local = matd_create_scalar((double)a[1]);
  }
  return a_local;
}

Assistant:

matd_t *matd_transpose(const matd_t *a)
{
    assert(a != NULL);

    if (matd_is_scalar(a))
        return matd_create_scalar(a->data[0]);

    matd_t *m = matd_create(a->ncols, a->nrows);

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(m, j, i) = MATD_EL(a, i, j);
        }
    }
    return m;
}